

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O0

void ADPCMA_calc_chan(YM2610 *F2610,ADPCM_CH *ch)

{
  byte local_1d;
  uint local_1c;
  UINT8 data;
  UINT32 step;
  ADPCM_CH *ch_local;
  YM2610 *F2610_local;
  
  if (ch->Muted == '\0') {
    ch->now_step = ch->step + ch->now_step;
    if (0xffff < ch->now_step) {
      local_1c = ch->now_step >> 0x10;
      ch->now_step = ch->now_step & 0xffff;
      do {
        if ((ch->now_addr & 0x1fffff) == (ch->end & 0xfffff) << 1) {
          ch->flag = '\0';
          F2610->adpcm_arrivedEndAddress = F2610->adpcm_arrivedEndAddress | ch->flagMask;
          return;
        }
        if ((ch->now_addr & 1) == 0) {
          ch->now_data = F2610->pcmbuf[ch->now_addr >> 1];
          local_1d = (byte)((int)(uint)ch->now_data >> 4);
        }
        else {
          local_1d = ch->now_data & 0xf;
        }
        ch->now_addr = ch->now_addr + 1;
        ch->adpcm_acc = jedi_table[(int)(ch->adpcm_step + (uint)local_1d)] + ch->adpcm_acc;
        ch->adpcm_acc = ch->adpcm_acc & 0xfff;
        if ((ch->adpcm_acc & 0x800U) != 0) {
          ch->adpcm_acc = ch->adpcm_acc | 0xfffff000;
        }
        ch->adpcm_step = step_inc[(int)(local_1d & 7)] + ch->adpcm_step;
        if (ch->adpcm_step < 0x301) {
          if (ch->adpcm_step < 0) {
            ch->adpcm_step = 0;
          }
        }
        else {
          ch->adpcm_step = 0x300;
        }
        local_1c = local_1c - 1;
      } while (local_1c != 0);
      ch->adpcm_out = ch->adpcm_acc * (int)ch->vol_mul >> (ch->vol_shift & 0x1f) & 0xfffffffc;
    }
    *ch->pan = ch->adpcm_out + *ch->pan;
  }
  return;
}

Assistant:

INLINE void ADPCMA_calc_chan( YM2610 *F2610, ADPCM_CH *ch )
{
	UINT32 step;
	UINT8  data;

	if (ch->Muted)
		return;


	ch->now_step += ch->step;
	if ( ch->now_step >= (1<<ADPCM_SHIFT) )
	{
		step = ch->now_step >> ADPCM_SHIFT;
		ch->now_step &= (1<<ADPCM_SHIFT)-1;
		do{
			/* end check */
			/* 11-06-2001 JB: corrected comparison. Was > instead of == */
			/* YM2610 checks lower 20 bits only, the 4 MSB bits are sample bank */
			/* Here we use 1<<21 to compensate for nibble calculations */

			if (   (ch->now_addr & ((1<<21)-1)) == ((ch->end<<1) & ((1<<21)-1))	   )
			{
				ch->flag = 0;
				F2610->adpcm_arrivedEndAddress |= ch->flagMask;
				return;
			}
#if 0
			if ( ch->now_addr > (F2610->pcm_size<<1) )
			{
				emu_logf(&F2610->OPN.logger, DEVLOG_WARN, "YM2610: Attempting to play past adpcm rom size!\n");
				return;
			}
#endif
			if ( ch->now_addr&1 )
				data = ch->now_data & 0x0f;
			else
			{
				ch->now_data = F2610->pcmbuf[ch->now_addr>>1];
				data = (ch->now_data >> 4) & 0x0f;
			}

			ch->now_addr++;

			ch->adpcm_acc += jedi_table[ch->adpcm_step + data];

			/* the 12-bit accumulator wraps on the ym2610 and ym2608 (like the msm5205), it does not saturate (like the msm5218) */
			ch->adpcm_acc &= 0xfff;

			/* extend 12-bit signed int */
			if (ch->adpcm_acc & 0x800)
				ch->adpcm_acc |= ~0xfff;

			ch->adpcm_step += step_inc[data & 7];
			Limit( ch->adpcm_step, 48*16, 0*16 );

		}while(--step);

		/* calc pcm * volume data */
		ch->adpcm_out = ((ch->adpcm_acc * ch->vol_mul) >> ch->vol_shift) & ~3;	/* multiply, shift and mask out 2 LSB bits */
	}

	/* output for work of output channels (out_adpcm[OPNxxxx])*/
	*(ch->pan) += ch->adpcm_out;
}